

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

bov_points_t * bov_points_new(GLfloat (*coords) [2],GLsizei n,GLenum usage)

{
  bov_points_t *pbVar1;
  GLsizei GVar2;
  
  pbVar1 = (bov_points_t *)malloc(0x50);
  if (pbVar1 != (bov_points_t *)0x0) {
    GVar2 = n;
    if (coords == (GLfloat (*) [2])0x0) {
      GVar2 = 0;
    }
    pbVar1->vboLen = GVar2;
    (pbVar1->param).fillColor[0] = 0.0;
    (pbVar1->param).fillColor[1] = 0.0;
    (pbVar1->param).fillColor[2] = 0.0;
    (pbVar1->param).fillColor[3] = 1.0;
    (pbVar1->param).outlineColor[0] = 1.0;
    (pbVar1->param).outlineColor[1] = 1.0;
    (pbVar1->param).outlineColor[2] = 1.0;
    (pbVar1->param).outlineColor[3] = 1.0;
    (pbVar1->param).pos[0] = 0.0;
    (pbVar1->param).pos[1] = 0.0;
    (pbVar1->param).scale[0] = 1.0;
    (pbVar1->param).scale[1] = 1.0;
    (pbVar1->param).width = 0.025;
    (pbVar1->param).marker = 0.0;
    (pbVar1->param).outlineWidth = -1.0;
    (pbVar1->param).spaceType = USUAL_SPACE;
    (*glad_glGenVertexArrays)(1,(GLuint *)pbVar1);
    (*glad_glBindVertexArray)(pbVar1->vao);
    (*glad_glGenBuffers)(1,&pbVar1->vbo);
    (*glad_glBindBuffer)(0x8892,pbVar1->vbo);
    (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(0);
    (*glad_glBufferData)(0x8892,(long)n * 8,coords,usage);
    pbVar1->vboCapacity = n;
    return pbVar1;
  }
  bov_error_log(0x30001,"Memory allocation failed");
  fprintf(_stderr,"\t(in function %s, line %d)\n","bov_points_new",0x506);
  exit(1);
}

Assistant:

bov_points_t* bov_points_new(const GLfloat coords[][2],
                             GLsizei n,
                             GLenum usage)
{
	bov_points_t* points = malloc(sizeof(bov_points_t));
	CHECK_MALLOC(points);

	points->vboLen = coords==NULL ? 0 : n;

	points->param = (bov_points_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f}, // color
		.outlineColor = {1.0f ,1.0f, 1.0f, 1.0f}, // outlineColor
		.pos = {0.0f ,0.0f},           // other
		.scale = {1.0f, 1.0f},           // localPos
		.width = 0.025f,
		.marker = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE
	};

	// Create Vertex Array Object
	glGenVertexArrays(1, &points->vao);
	glBindVertexArray(points->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &points->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION, 2, GL_FLOAT, GL_FALSE, 0, 0);
	glEnableVertexAttribArray(POS_LOCATION);

	glBufferData(GL_ARRAY_BUFFER, sizeof(GLfloat) * 2 * n, coords, usage);
	points->vboCapacity = n;

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return points;
}